

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O2

cf_void_t hashtbl_remove_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len)

{
  byte bVar1;
  hashtbl_node_t *__ptr;
  int iVar2;
  cf_size_t cVar3;
  hashtbl_node **pphVar4;
  hashtbl_node **pphVar5;
  hashtbl_node_t *phVar6;
  uint uVar7;
  
  if (len == 0xffffffffffffffff) {
    uVar7 = 0;
    for (len = 1; bVar1 = *(byte *)((long)key + (len - 1)), bVar1 != 0; len = len + 1) {
      uVar7 = uVar7 * 0x21 + (uint)bVar1;
    }
  }
  else {
    uVar7 = 0;
    for (cVar3 = 0; len != cVar3; cVar3 = cVar3 + 1) {
      uVar7 = (uint)*(byte *)((long)key + cVar3) + uVar7 * 0x21;
    }
  }
  uVar7 = uVar7 & tbl->hashmsk;
  pphVar5 = tbl->table + uVar7;
  pphVar4 = pphVar5;
  phVar6 = (hashtbl_node_t *)0x0;
  while( true ) {
    __ptr = *pphVar4;
    if (__ptr == (hashtbl_node_t *)0x0) {
      return;
    }
    if ((((__ptr->hash == uVar7) && (__ptr->keylen == len)) && (__ptr->key != (void *)0x0)) &&
       (iVar2 = bcmp(__ptr->key,key,len), iVar2 == 0)) break;
    pphVar4 = &__ptr->next;
    phVar6 = __ptr;
  }
  pphVar4 = &phVar6->next;
  if (*pphVar5 == __ptr) {
    pphVar4 = pphVar5;
  }
  *pphVar4 = __ptr->next;
  if (tbl->callback != (cf_hashtbl_cb_f)0x0) {
    (*tbl->callback)(__ptr->value);
  }
  free(__ptr->key);
  free(__ptr);
  tbl->size = tbl->size - 1;
  return;
}

Assistant:

cf_void_t hashtbl_remove_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR, *prev = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         prev = node, node = node->next) {
        if (node->hash == hash && node->keylen == len
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            if (*list_entry == node) {
                *list_entry = node->next;
            } else {
                prev->next = node->next;   
            }
            if (tbl->callback) {
                tbl->callback(node->value);
            }
            cf_free_native(node->key);
            cf_free_native(node);

            tbl->size--;
            return;
        }
    }
}